

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockSupport.cpp
# Opt level: O2

bool __thiscall MockSupport::wasLastActualCallFulfilled(MockSupport *this)

{
  bool bVar1;
  int iVar2;
  MockSupport *node;
  MockSupport *pMVar3;
  MockSupport *pMVar4;
  bool bVar5;
  
  if ((this->lastActualFunctionCall_ != (MockCheckedActualCall *)0x0) &&
     (iVar2 = (*(this->lastActualFunctionCall_->super_MockActualCall)._vptr_MockActualCall[0x2f])(),
     (char)iVar2 == '\0')) {
    return false;
  }
  pMVar4 = (MockSupport *)&this->data_;
  node = (MockSupport *)MockNamedValueList::begin((MockNamedValueList *)pMVar4);
  do {
    bVar5 = node == (MockSupport *)0x0;
    if (bVar5) {
      return bVar5;
    }
    pMVar3 = getMockSupport(pMVar4,(MockNamedValueListNode *)node);
    if (pMVar3 != (MockSupport *)0x0) {
      pMVar4 = getMockSupport(pMVar4,(MockNamedValueListNode *)node);
      bVar1 = wasLastActualCallFulfilled(pMVar4);
      if (!bVar1) {
        return bVar5;
      }
    }
    pMVar4 = node;
    node = (MockSupport *)MockNamedValueListNode::next((MockNamedValueListNode *)node);
  } while( true );
}

Assistant:

bool MockSupport::wasLastActualCallFulfilled()
{
    if (lastActualFunctionCall_ && !lastActualFunctionCall_->isFulfilled())
        return false;

    for (MockNamedValueListNode* p = data_.begin(); p; p = p->next())
        if (getMockSupport(p) && !getMockSupport(p)->wasLastActualCallFulfilled())
                return false;

    return true;
}